

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_alloc_src_diff_buf(AV1Common *cm,macroblock *mb)

{
  int iVar1;
  void *pvVar2;
  size_t in_RSI;
  AV1_COMMON *in_RDI;
  int sb_size;
  int subsampling_xy;
  int plane;
  int num_planes;
  int local_18;
  
  iVar1 = av1_num_planes(in_RDI);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    pvVar2 = aom_memalign((size_t)in_RDI,in_RSI);
    *(void **)(in_RSI + (long)local_18 * 0x88) = pvVar2;
    if (*(long *)(in_RSI + (long)local_18 * 0x88) == 0) {
      aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate mb->plane[plane].src_diff");
    }
  }
  return;
}

Assistant:

void av1_alloc_src_diff_buf(const struct AV1Common *cm, struct macroblock *mb) {
  const int num_planes = av1_num_planes(cm);
#ifndef NDEBUG
  for (int plane = 0; plane < num_planes; ++plane) {
    assert(!mb->plane[plane].src_diff);
  }
#endif
  for (int plane = 0; plane < num_planes; ++plane) {
    const int subsampling_xy =
        plane ? cm->seq_params->subsampling_x + cm->seq_params->subsampling_y
              : 0;
    const int sb_size = MAX_SB_SQUARE >> subsampling_xy;
    CHECK_MEM_ERROR(cm, mb->plane[plane].src_diff,
                    (int16_t *)aom_memalign(
                        32, sizeof(*mb->plane[plane].src_diff) * sb_size));
  }
}